

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

int4 __thiscall TypeCode::compareBasic(TypeCode *this,TypeCode *op)

{
  int iVar1;
  type_metatype tVar2;
  bool bVar3;
  int4 iVar4;
  type_metatype tVar5;
  int4 iVar6;
  uint4 uVar7;
  uint4 uVar8;
  string *__lhs;
  string *__rhs;
  uint4 opflags;
  uint4 flags;
  int4 opnump;
  int4 nump;
  string *model2;
  string *model1;
  TypeCode *op_local;
  TypeCode *this_local;
  
  iVar1 = (this->super_Datatype).size;
  iVar4 = Datatype::getSize(&op->super_Datatype);
  if (iVar1 == iVar4) {
    tVar2 = (this->super_Datatype).metatype;
    tVar5 = Datatype::getMetatype(&op->super_Datatype);
    if (tVar2 == tVar5) {
      if (this->proto == (FuncProto *)0x0) {
        if (op->proto == (FuncProto *)0x0) {
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else if (op->proto == (FuncProto *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        bVar3 = FuncProto::hasModel(this->proto);
        if (bVar3) {
          bVar3 = FuncProto::hasModel(op->proto);
          if (!bVar3) {
            return -1;
          }
          __lhs = FuncProto::getModelName_abi_cxx11_(this->proto);
          __rhs = FuncProto::getModelName_abi_cxx11_(op->proto);
          bVar3 = std::operator!=(__lhs,__rhs);
          if (bVar3) {
            bVar3 = std::operator<(__lhs,__rhs);
            if (!bVar3) {
              return 1;
            }
            return -1;
          }
        }
        else {
          bVar3 = FuncProto::hasModel(op->proto);
          if (bVar3) {
            return 1;
          }
        }
        iVar4 = FuncProto::numParams(this->proto);
        iVar6 = FuncProto::numParams(op->proto);
        if (iVar4 == iVar6) {
          uVar7 = FuncProto::getComparableFlags(this->proto);
          uVar8 = FuncProto::getComparableFlags(op->proto);
          if (uVar7 == uVar8) {
            this_local._4_4_ = 2;
          }
          else {
            this_local._4_4_ = 1;
            if (uVar7 < uVar8) {
              this_local._4_4_ = -1;
            }
          }
        }
        else {
          this_local._4_4_ = 1;
          if (iVar6 < iVar4) {
            this_local._4_4_ = -1;
          }
        }
      }
    }
    else {
      tVar2 = (this->super_Datatype).metatype;
      tVar5 = Datatype::getMetatype(&op->super_Datatype);
      this_local._4_4_ = 1;
      if ((int)tVar2 < (int)tVar5) {
        this_local._4_4_ = -1;
      }
    }
  }
  else {
    iVar4 = Datatype::getSize(&op->super_Datatype);
    this_local._4_4_ = 1;
    if (iVar4 < (this->super_Datatype).size) {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int4 TypeCode::compareBasic(const TypeCode *op) const

{
  if (size != op->getSize()) return (op->getSize() < size) ? -1 : 1;
  if (metatype != op->getMetatype()) return (metatype < op->getMetatype()) ? -1 : 1;

  if (proto == (FuncProto *)0) {
    if (op->proto == (FuncProto *)0) return 0;
    return 1;
  }
  if (op->proto == (FuncProto *)0)
    return -1;

  if (!proto->hasModel()) {
    if (op->proto->hasModel()) return 1;
  }
  else {
    if (!op->proto->hasModel()) return -1;
    const string &model1(proto->getModelName());
    const string &model2(op->proto->getModelName());
    if (model1 != model2)
      return (model1 < model2) ? -1 : 1;
  }
  int4 nump = proto->numParams();
  int4 opnump = op->proto->numParams();
  if (nump != opnump)
    return (opnump < nump) ? -1 : 1;
  uint4 flags = proto->getComparableFlags();
  uint4 opflags = op->proto->getComparableFlags();
  if (flags != opflags)
    return (flags < opflags) ? -1 : 1;

  return 2;			// Carry on with comparison of parameters
}